

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O0

uint uv__kernel_version(void)

{
  int iVar1;
  uint uVar2;
  int local_1a4;
  int local_1a0;
  uint patch;
  uint minor;
  uint major;
  uint version;
  utsname u;
  
  minor = uv__kernel_version::cached_version;
  if (uv__kernel_version::cached_version == 0) {
    iVar1 = uname((utsname *)((long)&major + 2));
    if (iVar1 == -1) {
      u.domainname[0x39] = '\0';
      u.domainname[0x3a] = '\0';
      u.domainname[0x3b] = '\0';
      u.domainname[0x3c] = '\0';
    }
    else {
      iVar1 = sscanf(u.nodename + 0x39,"%u.%u.%u",&patch,&local_1a0,&local_1a4);
      if (iVar1 == 3) {
        uv__kernel_version::cached_version = patch * 0x10000 + local_1a0 * 0x100 + local_1a4;
        u.domainname._57_4_ = uv__kernel_version::cached_version;
      }
      else {
        u.domainname[0x39] = '\0';
        u.domainname[0x3a] = '\0';
        u.domainname[0x3b] = '\0';
        u.domainname[0x3c] = '\0';
      }
    }
  }
  else {
    u.domainname._57_4_ = uv__kernel_version::cached_version;
  }
  uVar2._0_1_ = u.domainname[0x39];
  uVar2._1_1_ = u.domainname[0x3a];
  uVar2._2_1_ = u.domainname[0x3b];
  uVar2._3_1_ = u.domainname[0x3c];
  return uVar2;
}

Assistant:

unsigned uv__kernel_version(void) {
  static _Atomic unsigned cached_version;
  struct utsname u;
  unsigned version;
  unsigned major;
  unsigned minor;
  unsigned patch;

  version = atomic_load_explicit(&cached_version, memory_order_relaxed);
  if (version != 0)
    return version;

  if (-1 == uname(&u))
    return 0;

  if (3 != sscanf(u.release, "%u.%u.%u", &major, &minor, &patch))
    return 0;

  version = major * 65536 + minor * 256 + patch;
  atomic_store_explicit(&cached_version, version, memory_order_relaxed);

  return version;
}